

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_open_filename.c
# Opt level: O1

wchar_t file_open(archive *a,void *client_data)

{
  wchar_t wVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  wchar_t *pwVar5;
  char *fmt;
  char *mbs;
  wchar_t *wcs;
  stat st;
  wchar_t *local_c8;
  wchar_t *local_c0;
  stat local_b8;
  
  local_c8 = (wchar_t *)0x0;
  local_c0 = (wchar_t *)0x0;
  wVar1 = archive_mstring_get_mbs(a,(archive_mstring *)((long)client_data + 8),(char **)&local_c8);
  if (wVar1 == L'\0') {
    iVar2 = open((char *)local_c8,0x80241,0x1b6);
    *(int *)client_data = iVar2;
    __archive_ensure_cloexec_flag(iVar2);
    pwVar5 = local_c8;
    if (*client_data < 0) {
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (pwVar5 == (wchar_t *)0x0) {
        fmt = "Failed to open \'%S\'";
        pwVar5 = local_c0;
      }
      else {
        fmt = "Failed to open \'%s\'";
      }
    }
    else {
      iVar2 = fstat(*client_data,&local_b8);
      pwVar5 = local_c8;
      if (iVar2 == 0) {
        iVar2 = archive_write_get_bytes_in_last_block(a);
        if (iVar2 < 0) {
          uVar3 = local_b8.st_mode & 0xf000;
          iVar2 = 0;
          if (((uVar3 != 0x1000) && (iVar2 = 0, uVar3 != 0x2000)) && (iVar2 = 0, uVar3 != 0x6000)) {
            iVar2 = 1;
          }
          archive_write_set_bytes_in_last_block(a,iVar2);
        }
        if ((local_b8.st_mode & 0xf000) == 0x8000) {
          archive_write_set_skip_file(a,local_b8.st_dev,local_b8.st_ino);
          return L'\0';
        }
        return L'\0';
      }
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      if (pwVar5 == (wchar_t *)0x0) {
        fmt = "Couldn\'t stat \'%S\'";
        pwVar5 = local_c0;
      }
      else {
        fmt = "Couldn\'t stat \'%s\'";
      }
    }
  }
  else {
    piVar4 = __errno_location();
    if (*piVar4 == 0xc) {
      archive_set_error(a,0xc,"No memory");
      return L'\xffffffe2';
    }
    archive_mstring_get_wcs(a,(archive_mstring *)((long)client_data + 8),&local_c0);
    iVar2 = *piVar4;
    fmt = "Can\'t convert \'%S\' to MBS";
    pwVar5 = local_c0;
  }
  archive_set_error(a,iVar2,fmt,pwVar5);
  return L'\xffffffe2';
}

Assistant:

static int
file_open(struct archive *a, void *client_data)
{
	int flags;
	struct write_file_data *mine;
	struct stat st;
#if defined(_WIN32) && !defined(__CYGWIN__)
	wchar_t *fullpath;
#endif
	const wchar_t *wcs;
	const char *mbs;

	mine = (struct write_file_data *)client_data;
	flags = O_WRONLY | O_CREAT | O_TRUNC | O_BINARY | O_CLOEXEC;

	/*
	 * Open the file.
	 */
	mbs = NULL; wcs = NULL;
#if defined(_WIN32) && !defined(__CYGWIN__)
	if (archive_mstring_get_wcs(a, &mine->filename, &wcs) != 0) {
		if (errno == ENOMEM)
			archive_set_error(a, errno, "No memory");
		else {
			archive_mstring_get_mbs(a, &mine->filename, &mbs);
			archive_set_error(a, errno,
			    "Can't convert '%s' to WCS", mbs);
		}
		return (ARCHIVE_FATAL);
	}
	fullpath = __la_win_permissive_name_w(wcs);
	if (fullpath != NULL) {
		mine->fd = _wopen(fullpath, flags, 0666);
		free(fullpath);
	} else
		mine->fd = _wopen(wcs, flags, 0666);
#else
	if (archive_mstring_get_mbs(a, &mine->filename, &mbs) != 0) {
		if (errno == ENOMEM)
			archive_set_error(a, errno, "No memory");
		else {
			archive_mstring_get_wcs(a, &mine->filename, &wcs);
			archive_set_error(a, errno,
			    "Can't convert '%S' to MBS", wcs);
		}
		return (ARCHIVE_FATAL);
	}
	mine->fd = open(mbs, flags, 0666);
	__archive_ensure_cloexec_flag(mine->fd);
#endif
	if (mine->fd < 0) {
		if (mbs != NULL)
			archive_set_error(a, errno, "Failed to open '%s'", mbs);
		else
			archive_set_error(a, errno, "Failed to open '%S'", wcs);
		return (ARCHIVE_FATAL);
	}

	if (fstat(mine->fd, &st) != 0) {
		if (mbs != NULL)
			archive_set_error(a, errno, "Couldn't stat '%s'", mbs);
		else
			archive_set_error(a, errno, "Couldn't stat '%S'", wcs);
		return (ARCHIVE_FATAL);
	}

	/*
	 * Set up default last block handling.
	 */
	if (archive_write_get_bytes_in_last_block(a) < 0) {
		if (S_ISCHR(st.st_mode) || S_ISBLK(st.st_mode) ||
		    S_ISFIFO(st.st_mode))
			/* Pad last block when writing to device or FIFO. */
			archive_write_set_bytes_in_last_block(a, 0);
		else
			/* Don't pad last block otherwise. */
			archive_write_set_bytes_in_last_block(a, 1);
	}

	/*
	 * If the output file is a regular file, don't add it to
	 * itself.  If it's a device file, it's okay to add the device
	 * entry to the output archive.
	 */
	if (S_ISREG(st.st_mode))
		archive_write_set_skip_file(a, st.st_dev, st.st_ino);

	return (ARCHIVE_OK);
}